

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  SourceFile file_05;
  SourceFile file_06;
  SourceFile file_07;
  SourceFile file_08;
  bool bVar1;
  LogLevel LVar2;
  int cdaemonresult;
  char *pDBInfo;
  int port;
  undefined8 in_stack_ffffffffffff5ff8;
  int line;
  Logger *pLVar3;
  Signal *in_stack_ffffffffffff6000;
  Logger *in_stack_ffffffffffff6008;
  SourceFile *in_stack_ffffffffffff6010;
  Logger *in_stack_ffffffffffff6030;
  char *in_stack_ffffffffffff6060;
  Config *in_stack_ffffffffffff6068;
  char *in_stack_ffffffffffff62d0;
  Config *in_stack_ffffffffffff62d8;
  Logger local_8f48;
  Logger local_7f60;
  Logger local_6f78;
  int local_5f9c;
  Logger local_5f88;
  Logger local_4fa0;
  Logger local_3fb8;
  Logger local_2fd0;
  char *local_1ff8;
  Logger local_1fe0;
  int local_1008;
  Logger local_fe8;
  undefined4 local_4;
  
  local_4 = 0;
  g_stopEvent = 0;
  g_filep = (FILE *)fopen("../flyd_log","ae");
  if ((FILE *)g_filep == (FILE *)0x0) {
    printf(anon_var_dwarf_471);
  }
  muduo::Logger::setOutput(dummyOutput);
  muduo::Logger::setFlush(dummyFlush);
  muduo::Logger::setLogLevel(DEBUG);
  flyd::Singleton<flyd::Signal>::getInstance();
  flyd::Signal::Init(in_stack_ffffffffffff6000);
  flyd::Singleton<flyd::Config>::getInstance();
  bVar1 = flyd::Config::Load(in_stack_ffffffffffff62d8,in_stack_ffffffffffff62d0);
  if (!bVar1) {
    muduo::Logger::SourceFile::SourceFile<93>
              (in_stack_ffffffffffff6010,(char (*) [93])in_stack_ffffffffffff6008);
    file._8_8_ = in_stack_ffffffffffff6010;
    file.data_ = (char *)in_stack_ffffffffffff6008;
    muduo::Logger::Logger
              ((Logger *)in_stack_ffffffffffff6000,file,
               (int)((ulong)in_stack_ffffffffffff5ff8 >> 0x20),(LogLevel)in_stack_ffffffffffff5ff8);
    muduo::Logger::stream(&local_fe8);
    muduo::LogStream::operator<<
              ((LogStream *)in_stack_ffffffffffff6010,(char *)in_stack_ffffffffffff6008);
    muduo::Logger::~Logger(in_stack_ffffffffffff6030);
  }
  CMemory::GetInstance();
  CCRC32::GetInstance();
  flyd::Singleton<flyd::Config>::getInstance();
  local_1008 = flyd::Config::GetIntDefault
                         ((Config *)in_stack_ffffffffffff6008,(char *)in_stack_ffffffffffff6000,
                          (int)((ulong)in_stack_ffffffffffff5ff8 >> 0x20));
  LVar2 = muduo::Logger::logLevel();
  if ((int)LVar2 < 3) {
    muduo::Logger::SourceFile::SourceFile<93>
              (in_stack_ffffffffffff6010,(char (*) [93])in_stack_ffffffffffff6008);
    file_00._8_8_ = in_stack_ffffffffffff6010;
    file_00.data_ = (char *)in_stack_ffffffffffff6008;
    muduo::Logger::Logger
              ((Logger *)in_stack_ffffffffffff6000,file_00,
               (int)((ulong)in_stack_ffffffffffff5ff8 >> 0x20));
    muduo::Logger::stream(&local_1fe0);
    muduo::LogStream::operator<<
              ((LogStream *)in_stack_ffffffffffff6010,(char *)in_stack_ffffffffffff6008);
    muduo::LogStream::operator<<
              ((LogStream *)in_stack_ffffffffffff6000,
               (int)((ulong)in_stack_ffffffffffff5ff8 >> 0x20));
    muduo::Logger::~Logger(in_stack_ffffffffffff6030);
  }
  flyd::Singleton<flyd::Config>::getInstance();
  local_1ff8 = flyd::Config::GetString(in_stack_ffffffffffff6068,in_stack_ffffffffffff6060);
  if (local_1ff8 == (char *)0x0) {
    muduo::Logger::SourceFile::SourceFile<93>
              (in_stack_ffffffffffff6010,(char (*) [93])in_stack_ffffffffffff6008);
    file_02._8_8_ = in_stack_ffffffffffff6010;
    file_02.data_ = (char *)in_stack_ffffffffffff6008;
    muduo::Logger::Logger
              ((Logger *)in_stack_ffffffffffff6000,file_02,
               (int)((ulong)in_stack_ffffffffffff5ff8 >> 0x20),(LogLevel)in_stack_ffffffffffff5ff8);
    muduo::Logger::stream(&local_3fb8);
    muduo::LogStream::operator<<
              ((LogStream *)in_stack_ffffffffffff6010,(char *)in_stack_ffffffffffff6008);
    muduo::Logger::~Logger(in_stack_ffffffffffff6030);
  }
  else {
    LVar2 = muduo::Logger::logLevel();
    if ((int)LVar2 < 3) {
      muduo::Logger::SourceFile::SourceFile<93>
                (in_stack_ffffffffffff6010,(char (*) [93])in_stack_ffffffffffff6008);
      file_01._8_8_ = in_stack_ffffffffffff6010;
      file_01.data_ = (char *)in_stack_ffffffffffff6008;
      muduo::Logger::Logger
                ((Logger *)in_stack_ffffffffffff6000,file_01,
                 (int)((ulong)in_stack_ffffffffffff5ff8 >> 0x20));
      muduo::Logger::stream(&local_2fd0);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffff6010,(char *)in_stack_ffffffffffff6008);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffff6010,(char *)in_stack_ffffffffffff6008);
      muduo::Logger::~Logger(in_stack_ffffffffffff6030);
    }
  }
  flyd_pid = getpid();
  flyd_parent = getppid();
  LVar2 = muduo::Logger::logLevel();
  if ((int)LVar2 < 3) {
    muduo::Logger::SourceFile::SourceFile<93>
              (in_stack_ffffffffffff6010,(char (*) [93])in_stack_ffffffffffff6008);
    pLVar3 = &local_4fa0;
    file_03._8_8_ = in_stack_ffffffffffff6010;
    file_03.data_ = (char *)in_stack_ffffffffffff6008;
    muduo::Logger::Logger
              ((Logger *)in_stack_ffffffffffff6000,file_03,
               (int)((ulong)in_stack_ffffffffffff5ff8 >> 0x20));
    muduo::Logger::stream(pLVar3);
    muduo::LogStream::operator<<
              ((LogStream *)in_stack_ffffffffffff6010,(char *)in_stack_ffffffffffff6008);
    muduo::LogStream::operator<<
              ((LogStream *)in_stack_ffffffffffff6000,
               (int)((ulong)in_stack_ffffffffffff5ff8 >> 0x20));
    muduo::LogStream::operator<<
              ((LogStream *)in_stack_ffffffffffff6010,(char *)in_stack_ffffffffffff6008);
    muduo::LogStream::operator<<
              ((LogStream *)in_stack_ffffffffffff6000,
               (int)((ulong)in_stack_ffffffffffff5ff8 >> 0x20));
    muduo::Logger::~Logger(in_stack_ffffffffffff6030);
  }
  bVar1 = CLogicSocket::Initialize((CLogicSocket *)in_stack_ffffffffffff6000);
  if (!bVar1) {
    muduo::Logger::SourceFile::SourceFile<93>
              (in_stack_ffffffffffff6010,(char (*) [93])in_stack_ffffffffffff6008);
    file_04._8_8_ = in_stack_ffffffffffff6010;
    file_04.data_ = (char *)in_stack_ffffffffffff6008;
    muduo::Logger::Logger
              ((Logger *)in_stack_ffffffffffff6000,file_04,
               (int)((ulong)in_stack_ffffffffffff5ff8 >> 0x20),(LogLevel)in_stack_ffffffffffff5ff8);
    muduo::Logger::stream(&local_5f88);
    muduo::LogStream::operator<<
              ((LogStream *)in_stack_ffffffffffff6010,(char *)in_stack_ffffffffffff6008);
    muduo::Logger::~Logger(in_stack_ffffffffffff6030);
  }
  local_5f9c = flyd::flyd_daemon();
  if (local_5f9c == -1) {
    muduo::Logger::SourceFile::SourceFile<93>
              (in_stack_ffffffffffff6010,(char (*) [93])in_stack_ffffffffffff6008);
    file_05._8_8_ = in_stack_ffffffffffff6010;
    file_05.data_ = (char *)in_stack_ffffffffffff6008;
    muduo::Logger::Logger
              ((Logger *)in_stack_ffffffffffff6000,file_05,
               (int)((ulong)in_stack_ffffffffffff5ff8 >> 0x20),(LogLevel)in_stack_ffffffffffff5ff8);
    in_stack_ffffffffffff6030 = (Logger *)muduo::Logger::stream(&local_6f78);
    muduo::LogStream::operator<<
              ((LogStream *)in_stack_ffffffffffff6010,(char *)in_stack_ffffffffffff6008);
    muduo::Logger::~Logger(in_stack_ffffffffffff6030);
  }
  if (local_5f9c != 1) {
    LVar2 = muduo::Logger::logLevel();
    line = (int)((ulong)in_stack_ffffffffffff5ff8 >> 0x20);
    if ((int)LVar2 < 3) {
      muduo::Logger::SourceFile::SourceFile<93>
                (in_stack_ffffffffffff6010,(char (*) [93])in_stack_ffffffffffff6008);
      in_stack_ffffffffffff6008 = &local_8f48;
      file_07._8_8_ = in_stack_ffffffffffff6010;
      file_07.data_ = (char *)in_stack_ffffffffffff6008;
      muduo::Logger::Logger((Logger *)in_stack_ffffffffffff6000,file_07,line);
      in_stack_ffffffffffff6010 = (SourceFile *)muduo::Logger::stream(in_stack_ffffffffffff6008);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffff6010,(char *)in_stack_ffffffffffff6008);
      muduo::Logger::~Logger(in_stack_ffffffffffff6030);
    }
    flyd::flyd_master_process_cycle();
    LVar2 = muduo::Logger::logLevel();
    if ((int)LVar2 < 3) {
      muduo::Logger::SourceFile::SourceFile<93>
                (in_stack_ffffffffffff6010,(char (*) [93])in_stack_ffffffffffff6008);
      pLVar3 = (Logger *)&stack0xffffffffffff60d0;
      file_08._8_8_ = in_stack_ffffffffffff6010;
      file_08.data_ = (char *)in_stack_ffffffffffff6008;
      muduo::Logger::Logger
                ((Logger *)in_stack_ffffffffffff6000,file_08,(int)((ulong)pLVar3 >> 0x20));
      muduo::Logger::stream(pLVar3);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffff6010,(char *)in_stack_ffffffffffff6008);
      muduo::Logger::~Logger(in_stack_ffffffffffff6030);
    }
    return 0;
  }
  muduo::Logger::SourceFile::SourceFile<93>
            (in_stack_ffffffffffff6010,(char (*) [93])in_stack_ffffffffffff6008);
  file_06._8_8_ = in_stack_ffffffffffff6010;
  file_06.data_ = (char *)in_stack_ffffffffffff6008;
  muduo::Logger::Logger
            ((Logger *)in_stack_ffffffffffff6000,file_06,
             (int)((ulong)in_stack_ffffffffffff5ff8 >> 0x20),(LogLevel)in_stack_ffffffffffff5ff8);
  muduo::Logger::stream(&local_7f60);
  muduo::LogStream::operator<<
            ((LogStream *)in_stack_ffffffffffff6010,(char *)in_stack_ffffffffffff6008);
  muduo::Logger::~Logger(in_stack_ffffffffffff6030);
  exit(0);
}

Assistant:

int main(int argc, char **argv)
{
    //0表示不退出
    g_stopEvent = 0;

    g_filep = ::fopen("../flyd_log", "ae");
    if(!g_filep)
        printf("打开失败\n");
    muduo::Logger::setOutput(dummyOutput);
    muduo::Logger::setFlush(dummyFlush);
    muduo::Logger::setLogLevel(muduo::Logger::DEBUG);

    //初始化信号
    Singleton<Signal>::getInstance().Init();

     //读取配置文件
    if(!Singleton<Config>::getInstance().Load("../flyd.conf"))
    {
        LOG_FATAL<<"配置文件读取失败，退出！\n";
    }

    //内存单例类
    CMemory::GetInstance();

    //CRC校验算法单例类
    CCRC32::GetInstance();

    //得到监听端口号
    int port = Singleton<Config>::getInstance().GetIntDefault("ListenPort", 0);
    LOG_INFO << "port =" << port;
    //得到监听的地址
    const char *pDBInfo = Singleton<Config>::getInstance().GetString("DBInfo");
    if(pDBInfo != NULL)
    {
        LOG_INFO << "DBInfo = " << pDBInfo;
    }
    else
    {
        LOG_FATAL<<("DBInfo get failed\n");
    }

    flyd_pid = getpid();      //取得进程pid
    flyd_parent = getppid();     //取得父进程的id
    LOG_INFO << "主进程pid = "<< flyd_pid << "ppid = " << flyd_parent;

    if(!g_socket.Initialize())//初始化socket
    {
        LOG_FATAL << "socket initialize failed ";
    }


    int cdaemonresult = flyd_daemon();
    if(cdaemonresult == -1) //fork()失败
        LOG_ERROR << "cdaemonresult:master进程创建失败\n";
    if(cdaemonresult == 1)
    {
        LOG_WARN << "这是原始的父进程，退出\n";
      //  while(1);
        exit(0);
    }

    LOG_INFO << "master exit successfully \n " ;

    flyd_master_process_cycle();

    LOG_INFO << "exit successfully \n " ;

    return 0;
}